

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Zero24(void *destinationBuffer,int destinationStride,uint count)

{
  uchar *dest;
  uint count_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  dest = (uchar *)destinationBuffer;
  count_local = count;
  while (count_local != 0) {
    *dest = '\0';
    dest[1] = '\0';
    dest[2] = '\0';
    dest = dest + destinationStride * 3;
    count_local = count_local - 1;
  }
  return;
}

Assistant:

static void Zero24( void *destinationBuffer, signed int destinationStride,
        unsigned int count )
{
    unsigned char *dest = (unsigned char*)destinationBuffer;

    while( count-- )
    {
        dest[0] = 0;
        dest[1] = 0;
        dest[2] = 0;

        dest += destinationStride * 3;
    }
}